

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

void discordpp::from_json(json *j,field<discordpp::Snowflake> *f)

{
  bool bVar1;
  unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> local_20;
  field<discordpp::Snowflake> *local_18;
  field<discordpp::Snowflake> *f_local;
  json *j_local;
  
  local_18 = f;
  f_local = (field<discordpp::Snowflake> *)j;
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_null(j);
  if (bVar1) {
    std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::operator=
              (&local_18->t_,(nullptr_t)0x0);
    local_18->s_ = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::get<discordpp::Snowflake,discordpp::Snowflake>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)f_local);
    std::make_unique<discordpp::Snowflake,discordpp::Snowflake>((Snowflake *)&local_20);
    std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::operator=
              (&local_18->t_,&local_20);
    std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
              (&local_20);
    local_18->s_ = present_e;
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }